

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

ArguDesc *
cxxopts::values::parser_tool::ParseArgument
          (ArguDesc *__return_storage_ptr__,char *arg,bool *matched)

{
  char *pcVar1;
  char *pcVar2;
  pointer psVar3;
  long lVar4;
  sub_match<const_char_*> *psVar5;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  string_type local_38;
  
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result._M_begin = (char *)0x0;
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
            (arg,&result,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             (anonymous_namespace)::option_matcher_abi_cxx11_,0);
  *matched = 3 < (ulong)(((long)result.
                                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)result.
                               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  ArguDesc::ArguDesc(__return_storage_ptr__);
  if (*matched == true) {
    lVar4 = (long)result.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)result.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((lVar4 == 0) || (0xfffffffffffffffd < lVar4 / 0x18 - 5U)) {
      psVar5 = (sub_match<const_char_*> *)
               ((long)result.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4 + -0x48);
    }
    else {
      psVar5 = result.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    std::__cxx11::sub_match<const_char_*>::str(&local_38,psVar5);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    lVar4 = (long)result.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)result.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((lVar4 == 0) || (0xfffffffffffffffc < lVar4 / 0x18 - 6U)) {
      psVar3 = (pointer)((long)result.
                               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar4 + -0x48);
    }
    else {
      psVar3 = result.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 2;
    }
    pcVar1 = (psVar3->super_pair<const_char_*,_const_char_*>).second;
    pcVar2 = (psVar3->super_pair<const_char_*,_const_char_*>).first;
    __return_storage_ptr__->set_value =
         (bool)((pcVar1 != pcVar2 && -1 < (long)pcVar1 - (long)pcVar2) & psVar3->matched);
    if ((result.
         super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
         .
         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         result.
         super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
         .
         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) || (0xfffffffffffffffb < lVar4 / 0x18 - 7U)) {
      psVar5 = (sub_match<const_char_*> *)
               ((long)result.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4 + -0x48);
    }
    else {
      psVar5 = result.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 3;
    }
    std::__cxx11::sub_match<const_char_*>::str(&local_38,psVar5);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->value,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    lVar4 = (long)result.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)result.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((lVar4 == 0) || (0xfffffffffffffffa < lVar4 / 0x18 - 8U)) {
      psVar3 = (pointer)((long)result.
                               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar4 + -0x48);
    }
    else {
      psVar3 = result.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 4;
    }
    if ((psVar3->matched == true) &&
       (pcVar1 = (psVar3->super_pair<const_char_*,_const_char_*>).second,
       pcVar2 = (psVar3->super_pair<const_char_*,_const_char_*>).first,
       pcVar1 != pcVar2 && -1 < (long)pcVar1 - (long)pcVar2)) {
      __return_storage_ptr__->grouping = true;
      if ((result.
           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           .
           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           result.
           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           .
           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) || (0xfffffffffffffffa < lVar4 / 0x18 - 8U))
      {
        psVar5 = (sub_match<const_char_*> *)
                 ((long)result.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar4 + -0x48);
      }
      else {
        psVar5 = result.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4;
      }
      std::__cxx11::sub_match<const_char_*>::str(&local_38,psVar5);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  std::
  _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)&result);
  return __return_storage_ptr__;
}

Assistant:

inline ArguDesc ParseArgument(const char *arg, bool &matched)
{
  std::match_results<const char*> result;
  std::regex_match(arg, result, option_matcher);
  matched = !result.empty();

  ArguDesc argu_desc;
  if (matched) {
    argu_desc.arg_name = result[1].str();
    argu_desc.set_value = result[2].length() > 0;
    argu_desc.value = result[3].str();
    if (result[4].length() > 0)
    {
      argu_desc.grouping = true;
      argu_desc.arg_name = result[4].str();
    }
  }

  return argu_desc;
}